

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O2

type jsoncons::decode_base16<char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (char *first,char *last,vector<unsigned_char,_std::allocator<unsigned_char>_> *result
               )

{
  byte bVar1;
  undefined8 in_RAX;
  byte bVar2;
  undefined8 uVar3;
  byte *pbVar4;
  type tVar5;
  undefined8 uStack_38;
  
  uVar3 = 0x18;
  if (((int)last - (int)first & 1U) == 0) {
    uStack_38 = in_RAX;
    for (pbVar4 = (byte *)first; pbVar4 != (byte *)last; pbVar4 = pbVar4 + 2) {
      bVar1 = *pbVar4;
      if ((byte)(bVar1 - 0x30) < 10) {
        bVar1 = bVar1 << 4;
      }
      else {
        if (5 < (byte)((bVar1 | 0x20) + 0x9f)) goto LAB_001e986c;
        bVar1 = bVar1 * '\x10' + 0x90;
      }
      bVar2 = pbVar4[1] - 0x30;
      if (9 < bVar2) {
        bVar2 = pbVar4[1] | 0x20;
        if (5 < (byte)(bVar2 + 0x9f)) goto LAB_001e986c;
        bVar2 = bVar2 + 0xa9;
      }
      uStack_38 = CONCAT17(bVar2 | bVar1,(undefined7)uStack_38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (result,(value_type_conflict *)((long)&uStack_38 + 7));
    }
    uVar3 = 0;
    first = last;
  }
LAB_001e986c:
  tVar5._8_8_ = uVar3;
  tVar5.it = first;
  return tVar5;
}

Assistant:

typename std::enable_if<ext_traits::is_back_insertable_byte_container<Container>::value,decode_result<InputIt>>::type 
    decode_base16(InputIt first, InputIt last, Container& result)
    {
        std::size_t len = std::distance(first,last);
        if (len & 1) 
        {
            return decode_result<InputIt>{first, conv_errc::not_base16};
        }

        InputIt it = first;
        while (it != last)
        {
            uint8_t val;
            auto a = *it++;
            if (a >= '0' && a <= '9') 
            {
                val = static_cast<uint8_t>(a - '0') << 4;
            } 
            else if ((a | 0x20) >= 'a' && (a | 0x20) <= 'f') 
            {
                val = (static_cast<uint8_t>((a | 0x20) - 'a') + 10) << 4;
            } 
            else 
            {
                return decode_result<InputIt>{first, conv_errc::not_base16};
            }

            auto b = *it++;
            if (b >= '0' && b <= '9') 
            {
                val |= (b - '0');
            } 
            else if ((b | 0x20) >= 'a' && (b | 0x20) <= 'f') 
            {
                val |= ((b | 0x20) - 'a' + 10);
            } 
            else 
            {
                return decode_result<InputIt>{first, conv_errc::not_base16};
            }

            result.push_back(val);
        }
        return decode_result<InputIt>{last, conv_errc::success};
    }